

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CovergroupDeclarationSyntax *pCVar1;
  Token TVar2;
  Token TVar3;
  SyntaxNode **in_stack_00000020;
  Token *in_stack_00000028;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_00000030;
  Token *in_stack_00000038;
  NamedBlockClauseSyntax **in_stack_00000040;
  BumpAllocator *in_stack_00000068;
  Token *in_stack_00000070;
  BumpAllocator *in_stack_ffffffffffffff18;
  FunctionPortListSyntax *in_stack_ffffffffffffff20;
  BumpAllocator *in_stack_ffffffffffffffc0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffd0;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0);
  TVar2 = parsing::Token::deepClone(in_stack_00000070,in_stack_00000068);
  TVar3 = parsing::Token::deepClone(in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone(in_stack_00000070,in_stack_00000068);
  if (((BumpAllocator *)((long)__fn + 0x80))->head != (Segment *)0x0) {
    deepClone<slang::syntax::FunctionPortListSyntax>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if (((BumpAllocator *)((long)__fn + 0x80))->endPtr != (byte *)0x0) {
    deepClone(&in_stack_ffffffffffffff20->super_SyntaxNode,in_stack_ffffffffffffff18);
  }
  parsing::Token::deepClone(in_stack_00000070,in_stack_00000068);
  deepClone<slang::syntax::MemberSyntax>(TVar2._0_8_,(BumpAllocator *)TVar3.info);
  parsing::Token::deepClone(in_stack_00000070,in_stack_00000068);
  if (((BumpAllocator *)((long)__fn + 0xe0))->endPtr != (byte *)0x0) {
    deepClone<slang::syntax::NamedBlockClauseSyntax>
              ((NamedBlockClauseSyntax *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CovergroupDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPortListSyntax*,slang::syntax::SyntaxNode*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info,TVar3._0_8_,
                      in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
                      in_stack_00000040);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CovergroupDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CovergroupDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.covergroup.deepClone(alloc),
        node.extends.deepClone(alloc),
        node.name.deepClone(alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr,
        node.event ? deepClone(*node.event, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.endgroup.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}